

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::Data
          (Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *this,
          Data<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_> *other)

{
  uchar *puVar1;
  Entry *pEVar2;
  Span *pSVar3;
  Entry *pEVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  ulong uVar9;
  Node<int,_QEvdevTouchScreenData::Contact> *pNVar10;
  long lVar11;
  size_t sVar12;
  size_t sVar13;
  R RVar14;
  
  (this->ref).atomic._q_value.super___atomic_base<int>._M_i = 1;
  this->size = other->size;
  sVar12 = other->numBuckets;
  sVar13 = other->seed;
  this->numBuckets = other->numBuckets;
  this->seed = sVar13;
  this->spans = (Span *)0x0;
  RVar14 = allocateSpans(sVar12);
  this->spans = (Span *)RVar14.spans;
  if (RVar14.nSpans != 0) {
    lVar11 = 0;
    sVar12 = 0;
    do {
      pSVar3 = other->spans;
      sVar13 = 0;
      do {
        uVar9 = (ulong)pSVar3->offsets[sVar13 + lVar11];
        if (uVar9 != 0xff) {
          pEVar4 = pSVar3[sVar12].entries;
          pNVar10 = Span<QHashPrivate::Node<int,_QEvdevTouchScreenData::Contact>_>::insert
                              (this->spans + sVar12,sVar13);
          pEVar2 = pEVar4 + uVar9;
          uVar5 = *(undefined8 *)(pEVar2->storage).data;
          uVar6 = *(undefined8 *)((pEVar2->storage).data + 8);
          puVar1 = pEVar4[uVar9].storage.data + 0xc;
          uVar7 = *(undefined8 *)puVar1;
          uVar8 = *(undefined8 *)(puVar1 + 8);
          pNVar10->key = (int)uVar5;
          (pNVar10->value).trackingId = (int)((ulong)uVar5 >> 0x20);
          (pNVar10->value).x = (int)uVar6;
          (pNVar10->value).y = (int)((ulong)uVar6 >> 0x20);
          (pNVar10->value).y = (int)uVar7;
          (pNVar10->value).maj = (int)((ulong)uVar7 >> 0x20);
          (pNVar10->value).pressure = (int)uVar8;
          (pNVar10->value).state = (char)((ulong)uVar8 >> 0x20);
          *(int3 *)&(pNVar10->value).field_0x15 = (int3)((ulong)uVar8 >> 0x28);
        }
        sVar13 = sVar13 + 1;
      } while (sVar13 != 0x80);
      sVar12 = sVar12 + 1;
      lVar11 = lVar11 + 0x90;
    } while (sVar12 != RVar14.nSpans);
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }